

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::tessellation_shader
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ExpectResult expect;
  long lVar2;
  string simpleVtxFrag;
  string tessEvaluation;
  string tessControl;
  long *local_2d0;
  long local_2c8;
  long local_2c0 [2];
  long *local_2b0;
  long local_2a8;
  long local_2a0 [2];
  long *local_290;
  long local_288;
  long local_280 [2];
  uint local_270;
  value_type local_268;
  uint local_248;
  value_type local_240;
  uint local_220;
  value_type local_218;
  uint local_1f8;
  value_type local_1f0;
  string local_1d0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  deUint32 local_128;
  undefined1 local_120 [24];
  undefined1 uStack_108;
  ProgramSources local_100;
  
  bVar1 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_CONTROL);
  if (bVar1) {
    local_2d0 = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"#version 310 es\nvoid main()\n{\n}\n","");
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,
               "#version 310 es\nlayout(vertices = 3) out;\nvoid main()\n{\n}\n","");
    local_2b0 = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,
               "#version 310 es\nlayout(triangles, equal_spacing, cw) in;\nvoid main()\n{\n}\n","");
    local_1d0[0]._M_dataplus._M_p = (pointer)&local_1d0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,
               "GL_EXT_tessellation_shader features require enabling the extension in 310 es shaders."
               ,"");
    NegativeTestContext::beginSection(ctx,local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0[0]._M_dataplus._M_p != &local_1d0[0].field_2) {
      operator_delete(local_1d0[0]._M_dataplus._M_p,local_1d0[0].field_2._M_allocated_capacity + 1);
    }
    local_120[0x10] = 0;
    stack0xfffffffffffffef1 = 0;
    local_120._0_8_ = (pointer)0x0;
    local_120[8] = 0;
    local_120._9_7_ = 0;
    memset(local_1d0,0,0xac);
    local_1f8 = 0;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,local_2d0,local_2c8 + (long)local_2d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&local_1d0[0]._M_dataplus + (ulong)local_1f8 * 3),&local_1f0);
    local_220 = 3;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_290,local_288 + (long)local_290);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&local_1d0[0]._M_dataplus + (ulong)local_220 * 3),&local_218);
    local_248 = 4;
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_2b0,local_2a8 + (long)local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&local_1d0[0]._M_dataplus + (ulong)local_248 * 3),&local_240);
    local_270 = 1;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_2d0,local_2c8 + (long)local_2d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(&local_1d0[0]._M_dataplus + (ulong)local_270 * 3),&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    lVar2 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_100.sources[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar2),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&local_1d0[0]._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x90);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
              (&local_100.attribLocationBindings,&local_140);
    local_100.transformFeedbackBufferMode = local_128;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_100.transformFeedbackVaryings,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_120);
    local_100.separable = (bool)uStack_108;
    verifyProgram(ctx,&local_100,expect);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar2 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    NegativeTestContext::endSection(ctx);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_120);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_140);
    lVar2 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_1d0[0]._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    if (local_2b0 != local_2a0) {
      operator_delete(local_2b0,local_2a0[0] + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
    if (local_2d0 != local_2c0) {
      operator_delete(local_2d0,local_2c0[0] + 1);
    }
  }
  return;
}

Assistant:

void tessellation_shader (NegativeTestContext& ctx)
{
	if (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_CONTROL))
	{
		const std::string	simpleVtxFrag	=	"#version 310 es\n"
												"void main()\n"
												"{\n"
												"}\n";
		const std::string	tessControl		=	"#version 310 es\n"
												"layout(vertices = 3) out;\n"
												"void main()\n"
												"{\n"
												"}\n";
		const std::string	tessEvaluation	=	"#version 310 es\n"
												"layout(triangles, equal_spacing, cw) in;\n"
												"void main()\n"
												"{\n"
												"}\n";
		ctx.beginSection("GL_EXT_tessellation_shader features require enabling the extension in 310 es shaders.");
		glu::ProgramSources sources;
		sources << glu::VertexSource(simpleVtxFrag)
				<< glu::TessellationControlSource(tessControl)
				<< glu::TessellationEvaluationSource(tessEvaluation)
				<< glu::FragmentSource(simpleVtxFrag);
		verifyProgram(ctx, sources, EXPECT_RESULT_FAIL);
		ctx.endSection();
	}
}